

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_33c573::BuildEngineImpl::finishScanRequest
          (BuildEngineImpl *this,RuleInfo *inputRuleInfo,StateKind newState)

{
  bool bVar1;
  RuleScanRecord *scanRecord_00;
  reference __x;
  TaskInputRequest *request_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  *__range2_1;
  lock_guard<std::mutex> guard;
  RuleScanRequest *request;
  iterator __end2;
  iterator __begin2;
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
  *__range2;
  RuleScanRecord *scanRecord;
  StateKind newState_local;
  RuleInfo *inputRuleInfo_local;
  BuildEngineImpl *this_local;
  
  bVar1 = RuleInfo::isScanning(inputRuleInfo);
  if (!bVar1) {
    __assert_fail("inputRuleInfo.isScanning()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x2b3,
                  "void (anonymous namespace)::BuildEngineImpl::finishScanRequest(RuleInfo &, RuleInfo::StateKind)"
                 );
  }
  scanRecord_00 = RuleInfo::getPendingScanRecord(inputRuleInfo);
  __end2 = std::
           vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
           ::begin(&scanRecord_00->deferredScanRequests);
  request = (RuleScanRequest *)
            std::
            vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
            ::end(&scanRecord_00->deferredScanRequests);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
                                *)&request);
    if (!bVar1) break;
    guard._M_device =
         (mutex_type *)
         __gnu_cxx::
         __normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
         ::operator*(&__end2);
    std::
    vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
    ::push_back(&this->ruleInfosToScan,(value_type *)guard._M_device);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
    ::operator++(&__end2);
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&__range2_1,&this->inputRequestsMutex);
  __end2_1 = std::
             vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
             ::begin(&scanRecord_00->pausedInputRequests);
  request_1 = (TaskInputRequest *)
              std::
              vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
              ::end(&scanRecord_00->pausedInputRequests);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                        *)&request_1);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
          ::operator*(&__end2_1);
    std::
    deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
    ::push_back(&this->inputRequests,__x);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
    ::operator++(&__end2_1);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2_1);
  freeRuleScanRecord(this,scanRecord_00);
  RuleInfo::setPendingScanRecord(inputRuleInfo,(RuleScanRecord *)0x0);
  inputRuleInfo->state = newState;
  return;
}

Assistant:

void finishScanRequest(RuleInfo& inputRuleInfo,
                         RuleInfo::StateKind newState) {
    assert(inputRuleInfo.isScanning());
    auto scanRecord = inputRuleInfo.getPendingScanRecord();

    // Wake up all of the pending scan requests.
    for (const auto& request: scanRecord->deferredScanRequests) {
      ruleInfosToScan.push_back(request);
    }

    // Wake up all of the input requests on this rule.
    {
      std::lock_guard<std::mutex> guard(inputRequestsMutex);
      for (const auto& request: scanRecord->pausedInputRequests) {
        inputRequests.push_back(request);
      }
    }

    // Update the rule state.
    freeRuleScanRecord(scanRecord);
    inputRuleInfo.setPendingScanRecord(nullptr);
    inputRuleInfo.state = newState;
  }